

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O3

void __thiscall libcellml::Annotator::setModel(Annotator *this,ModelPtr *model)

{
  LoggerImpl *pLVar1;
  AnnotatorImpl *this_00;
  
  pLVar1 = Logger::pFunc(&this->super_Logger);
  pLVar1[1].mMessages.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)(model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
             &pLVar1[1].mMessages.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             &(model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_refcount)
  ;
  pLVar1 = Logger::pFunc(&this->super_Logger);
  pLVar1[1].mIssues.
  super__Vector_base<std::shared_ptr<libcellml::Issue>,_std::allocator<std::shared_ptr<libcellml::Issue>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_00 = (AnnotatorImpl *)Logger::pFunc(&this->super_Logger);
  AnnotatorImpl::update(this_00);
  return;
}

Assistant:

void Annotator::setModel(const ModelPtr &model)
{
    pFunc()->mModel = model;
    pFunc()->mHash = 0;
    pFunc()->update();
}